

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O1

void __thiscall TNT::Array2D<interval>::Array2D(Array2D<interval> *this,int m,int n)

{
  interval *piVar1;
  ulong uVar2;
  
  i_refvec<interval>::i_refvec((i_refvec<interval> *)this,n * m);
  (this->data_).n_ = n * m;
  (this->data_).data_ = (this->data_).v_.data_;
  i_refvec<interval_*>::i_refvec(&(this->v_).v_,m);
  (this->v_).n_ = m;
  (this->v_).data_ = (this->v_).v_.data_;
  this->m_ = m;
  this->n_ = n;
  if (0 < n && 0 < m) {
    piVar1 = (this->data_).data_;
    uVar2 = 0;
    do {
      (this->v_).data_[uVar2] = piVar1;
      uVar2 = uVar2 + 1;
      piVar1 = piVar1 + (uint)n;
    } while ((uint)m != uVar2);
  }
  return;
}

Assistant:

Array2D<T>::Array2D(int m, int n) : data_(m*n), v_(m), m_(m), n_(n)
{
	if (m>0 && n>0)
	{
		T* p = &(data_[0]);
		for (int i=0; i<m; i++)
		{
			v_[i] = p;
			p += n;
		}
	}
}